

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O2

bool google::protobuf::io::Tokenizer::ParseInteger(string *text,uint64 max_value,uint64 *output)

{
  char digit;
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  char *pcVar4;
  ulong uStack_40;
  
  pcVar4 = (text->_M_dataplus)._M_p;
  if (*pcVar4 == '0') {
    if ((byte)(pcVar4[1] | 0x20U) == 0x78) {
      pcVar4 = pcVar4 + 2;
      uStack_40 = 0x10;
    }
    else {
      uStack_40 = 8;
    }
  }
  else {
    uStack_40 = 10;
  }
  uVar3 = 0;
  for (; digit = *pcVar4, digit != '\0'; pcVar4 = pcVar4 + 1) {
    uVar1 = anon_unknown_4::DigitValue(digit);
    if ((uint)uStack_40 <= uVar1) goto LAB_002cd329;
    uVar2 = (ulong)uVar1;
    if ((max_value < uVar2) || ((max_value - uVar2) / uStack_40 < uVar3)) goto LAB_002cd329;
    uVar3 = uVar3 * uStack_40 + uVar2;
  }
  *output = uVar3;
LAB_002cd329:
  return digit == '\0';
}

Assistant:

bool Tokenizer::ParseInteger(const std::string& text, uint64 max_value,
                             uint64* output) {
  // Sadly, we can't just use strtoul() since it is only 32-bit and strtoull()
  // is non-standard.  I hate the C standard library.  :(

  //  return strtoull(text.c_str(), NULL, 0);

  const char* ptr = text.c_str();
  int base = 10;
  if (ptr[0] == '0') {
    if (ptr[1] == 'x' || ptr[1] == 'X') {
      // This is hex.
      base = 16;
      ptr += 2;
    } else {
      // This is octal.
      base = 8;
    }
  }

  uint64 result = 0;
  for (; *ptr != '\0'; ptr++) {
    int digit = DigitValue(*ptr);
    if (digit < 0 || digit >= base) {
      // The token provided by Tokenizer is invalid. i.e., 099 is an invalid
      // token, but Tokenizer still think it's integer.
      return false;
    }
    if (digit > max_value || result > (max_value - digit) / base) {
      // Overflow.
      return false;
    }
    result = result * base + digit;
  }

  *output = result;
  return true;
}